

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Eltwise_x86::forward
          (Eltwise_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  uint uVar7;
  Mat *m;
  Mat *this_00;
  size_t sVar8;
  _func_int **pp_Var9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  _func_int *p_Var15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  ulong uVar22;
  pointer pMVar23;
  ulong uVar24;
  pointer pMVar25;
  ulong uVar26;
  void *pvVar27;
  void *pvVar28;
  int iVar29;
  long lVar30;
  void *pvVar31;
  long lVar32;
  ulong uVar33;
  int iVar34;
  uint uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  iVar29 = m->elempack;
  uVar7 = m->c;
  uVar26 = (ulong)uVar7;
  iVar34 = m->h * m->w;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  pvVar27 = this_00->data;
  if (pvVar27 == (void *)0x0) {
    return -100;
  }
  sVar8 = this_00->cstep;
  if ((long)this_00->c * sVar8 != 0) {
    pp_Var9 = this->_vptr_Eltwise_x86;
    if (iVar29 == 4) {
      if (*(int *)(&this->field_0xd0 + (long)pp_Var9[-3]) == 0) {
        pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (0 < (int)uVar7) {
          uVar22 = 0;
          do {
            if (0 < iVar34) {
              sVar8 = pMVar25[1].cstep;
              sVar10 = m->cstep;
              sVar11 = m->elemsize;
              pvVar27 = m->data;
              sVar12 = pMVar25[1].elemsize;
              pvVar28 = pMVar25[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar31 = this_00->data;
              lVar30 = 0;
              iVar29 = iVar34;
              do {
                pfVar1 = (float *)((long)pvVar28 + lVar30 + sVar8 * sVar12 * uVar22);
                pfVar2 = (float *)((long)pvVar27 + lVar30 + sVar10 * sVar11 * uVar22);
                auVar39._0_4_ = *pfVar1 * *pfVar2;
                auVar39._4_4_ = pfVar1[1] * pfVar2[1];
                auVar39._8_4_ = pfVar1[2] * pfVar2[2];
                auVar39._12_4_ = pfVar1[3] * pfVar2[3];
                *(undefined1 (*) [16])((long)pvVar31 + lVar30 + sVar13 * sVar14 * uVar22) = auVar39;
                lVar30 = lVar30 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 != uVar26);
          pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        }
        pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (2 < (ulong)(((long)pMVar23 - (long)pMVar25 >> 3) * -0x71c71c71c71c71c7)) {
          uVar22 = 2;
          do {
            if (0 < (int)uVar7) {
              pMVar25 = pMVar25 + uVar22;
              uVar24 = 0;
              do {
                if (0 < iVar34) {
                  sVar8 = pMVar25->cstep;
                  sVar10 = pMVar25->elemsize;
                  pvVar27 = pMVar25->data;
                  lVar30 = this_00->cstep * this_00->elemsize * uVar24;
                  pvVar28 = this_00->data;
                  lVar32 = 0;
                  iVar29 = iVar34;
                  do {
                    pfVar1 = (float *)((long)pvVar27 + lVar32 + sVar8 * sVar10 * uVar24);
                    pfVar2 = (float *)((long)pvVar28 + lVar32 + lVar30);
                    auVar36._0_4_ = *pfVar1 * *pfVar2;
                    auVar36._4_4_ = pfVar1[1] * pfVar2[1];
                    auVar36._8_4_ = pfVar1[2] * pfVar2[2];
                    auVar36._12_4_ = pfVar1[3] * pfVar2[3];
                    *(undefined1 (*) [16])((long)pvVar28 + lVar32 + lVar30) = auVar36;
                    lVar32 = lVar32 + 0x10;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                uVar24 = uVar24 + 1;
              } while (uVar24 != uVar26);
              pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 < (ulong)(((long)pMVar23 - (long)pMVar25 >> 3) * -0x71c71c71c71c71c7));
        }
      }
      p_Var15 = pp_Var9[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var15) == 1) {
        pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(int *)(&this->field_0x104 + (long)p_Var15) == 0) {
          if (0 < (int)uVar7) {
            uVar22 = 0;
            do {
              if (0 < iVar34) {
                sVar8 = pMVar25[1].cstep;
                sVar10 = m->cstep;
                sVar11 = m->elemsize;
                pvVar27 = m->data;
                sVar12 = pMVar25[1].elemsize;
                pvVar28 = pMVar25[1].data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar31 = this_00->data;
                lVar30 = 0;
                iVar29 = iVar34;
                do {
                  pfVar1 = (float *)((long)pvVar28 + lVar30 + sVar8 * sVar12 * uVar22);
                  pfVar2 = (float *)((long)pvVar27 + lVar30 + sVar10 * sVar11 * uVar22);
                  auVar37._0_4_ = *pfVar1 + *pfVar2;
                  auVar37._4_4_ = pfVar1[1] + pfVar2[1];
                  auVar37._8_4_ = pfVar1[2] + pfVar2[2];
                  auVar37._12_4_ = pfVar1[3] + pfVar2[3];
                  *(undefined1 (*) [16])((long)pvVar31 + lVar30 + sVar13 * sVar14 * uVar22) =
                       auVar37;
                  lVar30 = lVar30 + 0x10;
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 != uVar26);
            pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          }
          pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          if (2 < (ulong)(((long)pMVar23 - (long)pMVar25 >> 3) * -0x71c71c71c71c71c7)) {
            uVar22 = 2;
            do {
              if (0 < (int)uVar7) {
                pMVar25 = pMVar25 + uVar22;
                uVar24 = 0;
                do {
                  if (0 < iVar34) {
                    sVar8 = pMVar25->cstep;
                    sVar10 = pMVar25->elemsize;
                    pvVar27 = pMVar25->data;
                    lVar30 = this_00->cstep * this_00->elemsize * uVar24;
                    pvVar28 = this_00->data;
                    lVar32 = 0;
                    iVar29 = iVar34;
                    do {
                      pfVar1 = (float *)((long)pvVar27 + lVar32 + sVar8 * sVar10 * uVar24);
                      pfVar2 = (float *)((long)pvVar28 + lVar32 + lVar30);
                      auVar38._0_4_ = *pfVar1 + *pfVar2;
                      auVar38._4_4_ = pfVar1[1] + pfVar2[1];
                      auVar38._8_4_ = pfVar1[2] + pfVar2[2];
                      auVar38._12_4_ = pfVar1[3] + pfVar2[3];
                      *(undefined1 (*) [16])((long)pvVar28 + lVar32 + lVar30) = auVar38;
                      lVar32 = lVar32 + 0x10;
                      iVar29 = iVar29 + -1;
                    } while (iVar29 != 0);
                  }
                  uVar24 = uVar24 + 1;
                } while (uVar24 != uVar26);
                pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 < (ulong)(((long)pMVar23 - (long)pMVar25 >> 3) * -0x71c71c71c71c71c7));
          }
        }
        else {
          if (0 < (int)uVar7) {
            fVar4 = **(float **)(&this->field_0xd8 + (long)p_Var15);
            fVar5 = (*(float **)(&this->field_0xd8 + (long)p_Var15))[1];
            uVar22 = 0;
            do {
              if (0 < iVar34) {
                sVar8 = this_00->cstep;
                sVar10 = pMVar25[1].cstep;
                sVar11 = this_00->elemsize;
                pvVar27 = this_00->data;
                sVar12 = pMVar25[1].elemsize;
                pvVar28 = pMVar25[1].data;
                sVar13 = m->cstep;
                sVar14 = m->elemsize;
                pvVar31 = m->data;
                lVar30 = 0;
                iVar29 = iVar34;
                do {
                  pfVar1 = (float *)((long)pvVar31 + lVar30 + sVar13 * sVar14 * uVar22);
                  fVar16 = pfVar1[1];
                  fVar17 = pfVar1[2];
                  fVar18 = pfVar1[3];
                  pfVar2 = (float *)((long)pvVar28 + lVar30 + sVar10 * sVar12 * uVar22);
                  fVar19 = pfVar2[1];
                  fVar20 = pfVar2[2];
                  fVar21 = pfVar2[3];
                  pfVar3 = (float *)((long)pvVar27 + lVar30 + sVar8 * sVar11 * uVar22);
                  *pfVar3 = *pfVar2 * fVar5 + *pfVar1 * fVar4;
                  pfVar3[1] = fVar19 * fVar5 + fVar16 * fVar4;
                  pfVar3[2] = fVar20 * fVar5 + fVar17 * fVar4;
                  pfVar3[3] = fVar21 * fVar5 + fVar18 * fVar4;
                  lVar30 = lVar30 + 0x10;
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 != uVar26);
            pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          }
          pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          if (2 < (ulong)(((long)pMVar23 - (long)pMVar25 >> 3) * -0x71c71c71c71c71c7)) {
            uVar22 = 2;
            do {
              if (0 < (int)uVar7) {
                pMVar25 = pMVar25 + uVar22;
                fVar4 = *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var9[-3]) + uVar22 * 4);
                uVar24 = 0;
                do {
                  if (0 < iVar34) {
                    lVar30 = this_00->cstep * this_00->elemsize * uVar24;
                    pvVar27 = this_00->data;
                    sVar8 = pMVar25->cstep;
                    sVar10 = pMVar25->elemsize;
                    pvVar28 = pMVar25->data;
                    lVar32 = 0;
                    iVar29 = iVar34;
                    do {
                      pfVar1 = (float *)((long)pvVar28 + lVar32 + sVar8 * sVar10 * uVar24);
                      fVar5 = pfVar1[1];
                      fVar16 = pfVar1[2];
                      fVar17 = pfVar1[3];
                      pfVar2 = (float *)((long)pvVar27 + lVar32 + lVar30);
                      fVar18 = pfVar2[1];
                      fVar19 = pfVar2[2];
                      fVar20 = pfVar2[3];
                      pfVar3 = (float *)((long)pvVar27 + lVar32 + lVar30);
                      *pfVar3 = *pfVar1 * fVar4 + *pfVar2;
                      pfVar3[1] = fVar5 * fVar4 + fVar18;
                      pfVar3[2] = fVar16 * fVar4 + fVar19;
                      pfVar3[3] = fVar17 * fVar4 + fVar20;
                      lVar32 = lVar32 + 0x10;
                      iVar29 = iVar29 + -1;
                    } while (iVar29 != 0);
                  }
                  uVar24 = uVar24 + 1;
                } while (uVar24 != uVar26);
                pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 < (ulong)(((long)pMVar23 - (long)pMVar25 >> 3) * -0x71c71c71c71c71c7));
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)pp_Var9[-3]) != 2) {
        return 0;
      }
      pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)uVar7) {
        uVar22 = 0;
        do {
          if (0 < iVar34) {
            sVar8 = this_00->cstep;
            sVar10 = pMVar25[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar27 = this_00->data;
            sVar12 = pMVar25[1].elemsize;
            pvVar28 = pMVar25[1].data;
            sVar13 = m->cstep;
            sVar14 = m->elemsize;
            pvVar31 = m->data;
            lVar30 = 0;
            iVar29 = iVar34;
            do {
              auVar39 = maxps(*(undefined1 (*) [16])
                               ((long)pvVar31 + lVar30 + sVar13 * sVar14 * uVar22),
                              *(undefined1 (*) [16])
                               ((long)pvVar28 + lVar30 + sVar10 * sVar12 * uVar22));
              *(undefined1 (*) [16])((long)pvVar27 + lVar30 + sVar8 * sVar11 * uVar22) = auVar39;
              lVar30 = lVar30 + 0x10;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar26);
        pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)(((long)pMVar23 - (long)pMVar25 >> 3) * -0x71c71c71c71c71c7) < 3) {
        return 0;
      }
      uVar22 = 2;
      do {
        if (0 < (int)uVar7) {
          pMVar25 = pMVar25 + uVar22;
          uVar24 = 0;
          do {
            if (0 < iVar34) {
              lVar30 = this_00->cstep * this_00->elemsize * uVar24;
              pvVar27 = this_00->data;
              sVar8 = pMVar25->cstep;
              sVar10 = pMVar25->elemsize;
              pvVar28 = pMVar25->data;
              lVar32 = 0;
              iVar29 = iVar34;
              do {
                auVar39 = maxps(*(undefined1 (*) [16])((long)pvVar27 + lVar32 + lVar30),
                                *(undefined1 (*) [16])
                                 ((long)pvVar28 + lVar32 + sVar8 * sVar10 * uVar24));
                *(undefined1 (*) [16])((long)pvVar27 + lVar32 + lVar30) = auVar39;
                lVar32 = lVar32 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar24 = uVar24 + 1;
          } while (uVar24 != uVar26);
          pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < (ulong)(((long)pMVar23 - (long)pMVar25 >> 3) * -0x71c71c71c71c71c7));
    }
    else {
      if (*(int *)(&this->field_0xd0 + (long)pp_Var9[-3]) == 0) {
        pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (0 < (int)uVar7) {
          pvVar28 = m->data;
          sVar10 = m->cstep;
          pvVar31 = pMVar25[1].data;
          sVar11 = pMVar25[1].cstep;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar25[1].elemsize;
          sVar14 = m->elemsize;
          uVar22 = 0;
          do {
            if (0 < iVar34) {
              lVar30 = 0;
              uVar35 = iVar34 + 1;
              do {
                *(float *)((long)pvVar27 + lVar30) =
                     *(float *)((long)pvVar31 + lVar30) * *(float *)((long)pvVar28 + lVar30);
                uVar35 = uVar35 - 1;
                lVar30 = lVar30 + 4;
              } while (1 < uVar35);
            }
            uVar22 = uVar22 + 1;
            pvVar27 = (void *)((long)pvVar27 + sVar12 * sVar8);
            pvVar31 = (void *)((long)pvVar31 + sVar11 * sVar13);
            pvVar28 = (void *)((long)pvVar28 + sVar10 * sVar14);
          } while (uVar22 != uVar26);
        }
        uVar22 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar25 >> 3) *
                 -0x71c71c71c71c71c7;
        if (2 < uVar22) {
          uVar24 = 2;
          do {
            if (0 < (int)uVar7) {
              pvVar27 = pMVar25[uVar24].data;
              sVar10 = pMVar25[uVar24].cstep;
              sVar11 = pMVar25[uVar24].elemsize;
              pvVar28 = this_00->data;
              sVar12 = this_00->elemsize;
              uVar33 = 0;
              do {
                if (0 < iVar34) {
                  lVar30 = 0;
                  uVar35 = iVar34 + 1;
                  do {
                    *(float *)((long)pvVar28 + lVar30) =
                         *(float *)((long)pvVar28 + lVar30) * *(float *)((long)pvVar27 + lVar30);
                    uVar35 = uVar35 - 1;
                    lVar30 = lVar30 + 4;
                  } while (1 < uVar35);
                }
                uVar33 = uVar33 + 1;
                pvVar28 = (void *)((long)pvVar28 + sVar12 * sVar8);
                pvVar27 = (void *)((long)pvVar27 + sVar10 * sVar11);
              } while (uVar33 != uVar26);
            }
            uVar24 = uVar24 + 1;
          } while (uVar24 != uVar22);
        }
      }
      p_Var15 = pp_Var9[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var15) == 1) {
        if (*(int *)(&this->field_0x104 + (long)p_Var15) == 0) {
          pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (0 < (int)uVar7) {
            pvVar27 = m->data;
            sVar10 = m->cstep;
            pvVar28 = pMVar25[1].data;
            sVar11 = pMVar25[1].cstep;
            pvVar31 = this_00->data;
            sVar12 = this_00->elemsize;
            sVar13 = pMVar25[1].elemsize;
            sVar14 = m->elemsize;
            uVar22 = 0;
            do {
              if (0 < iVar34) {
                lVar30 = 0;
                uVar35 = iVar34 + 1;
                do {
                  *(float *)((long)pvVar31 + lVar30) =
                       *(float *)((long)pvVar28 + lVar30) + *(float *)((long)pvVar27 + lVar30);
                  uVar35 = uVar35 - 1;
                  lVar30 = lVar30 + 4;
                } while (1 < uVar35);
              }
              uVar22 = uVar22 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar12 * sVar8);
              pvVar28 = (void *)((long)pvVar28 + sVar11 * sVar13);
              pvVar27 = (void *)((long)pvVar27 + sVar10 * sVar14);
            } while (uVar22 != uVar26);
          }
          uVar22 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar25 >> 3) *
                   -0x71c71c71c71c71c7;
          if (2 < uVar22) {
            uVar24 = 2;
            do {
              if (0 < (int)uVar7) {
                pvVar27 = pMVar25[uVar24].data;
                sVar10 = pMVar25[uVar24].cstep;
                sVar11 = pMVar25[uVar24].elemsize;
                pvVar28 = this_00->data;
                sVar12 = this_00->elemsize;
                uVar33 = 0;
                do {
                  if (0 < iVar34) {
                    lVar30 = 0;
                    uVar35 = iVar34 + 1;
                    do {
                      *(float *)((long)pvVar28 + lVar30) =
                           *(float *)((long)pvVar28 + lVar30) + *(float *)((long)pvVar27 + lVar30);
                      uVar35 = uVar35 - 1;
                      lVar30 = lVar30 + 4;
                    } while (1 < uVar35);
                  }
                  uVar33 = uVar33 + 1;
                  pvVar28 = (void *)((long)pvVar28 + sVar12 * sVar8);
                  pvVar27 = (void *)((long)pvVar27 + sVar10 * sVar11);
                } while (uVar33 != uVar26);
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 != uVar22);
          }
        }
        else {
          pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (0 < (int)uVar7) {
            uVar6 = **(undefined8 **)(&this->field_0xd8 + (long)p_Var15);
            pvVar27 = m->data;
            sVar10 = m->cstep;
            pvVar28 = pMVar25[1].data;
            sVar11 = pMVar25[1].cstep;
            pvVar31 = this_00->data;
            sVar12 = this_00->elemsize;
            sVar13 = pMVar25[1].elemsize;
            sVar14 = m->elemsize;
            uVar22 = 0;
            do {
              if (0 < iVar34) {
                lVar30 = 0;
                uVar35 = iVar34 + 1;
                do {
                  *(float *)((long)pvVar31 + lVar30) =
                       *(float *)((long)pvVar28 + lVar30) * (float)((ulong)uVar6 >> 0x20) +
                       *(float *)((long)pvVar27 + lVar30) * (float)uVar6;
                  uVar35 = uVar35 - 1;
                  lVar30 = lVar30 + 4;
                } while (1 < uVar35);
              }
              uVar22 = uVar22 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar12 * sVar8);
              pvVar28 = (void *)((long)pvVar28 + sVar11 * sVar13);
              pvVar27 = (void *)((long)pvVar27 + sVar10 * sVar14);
            } while (uVar22 != uVar26);
          }
          uVar22 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar25 >> 3) *
                   -0x71c71c71c71c71c7;
          if (2 < uVar22) {
            uVar24 = 2;
            do {
              if (0 < (int)uVar7) {
                fVar4 = *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var9[-3]) + uVar24 * 4);
                pvVar27 = pMVar25[uVar24].data;
                sVar10 = pMVar25[uVar24].cstep;
                sVar11 = pMVar25[uVar24].elemsize;
                pvVar28 = this_00->data;
                sVar12 = this_00->elemsize;
                uVar33 = 0;
                do {
                  if (0 < iVar34) {
                    lVar30 = 0;
                    uVar35 = iVar34 + 1;
                    do {
                      *(float *)((long)pvVar28 + lVar30) =
                           *(float *)((long)pvVar27 + lVar30) * fVar4 +
                           *(float *)((long)pvVar28 + lVar30);
                      uVar35 = uVar35 - 1;
                      lVar30 = lVar30 + 4;
                    } while (1 < uVar35);
                  }
                  uVar33 = uVar33 + 1;
                  pvVar28 = (void *)((long)pvVar28 + sVar12 * sVar8);
                  pvVar27 = (void *)((long)pvVar27 + sVar10 * sVar11);
                } while (uVar33 != uVar26);
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 != uVar22);
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)pp_Var9[-3]) != 2) {
        return 0;
      }
      pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)uVar7) {
        pvVar27 = m->data;
        sVar10 = m->cstep;
        pvVar28 = pMVar25[1].data;
        sVar11 = pMVar25[1].cstep;
        pvVar31 = this_00->data;
        sVar12 = this_00->elemsize;
        sVar13 = pMVar25[1].elemsize;
        sVar14 = m->elemsize;
        uVar22 = 0;
        do {
          if (0 < iVar34) {
            lVar30 = 0;
            uVar35 = iVar34 + 1;
            do {
              fVar4 = *(float *)((long)pvVar28 + lVar30);
              if (*(float *)((long)pvVar28 + lVar30) <= *(float *)((long)pvVar27 + lVar30)) {
                fVar4 = *(float *)((long)pvVar27 + lVar30);
              }
              *(float *)((long)pvVar31 + lVar30) = fVar4;
              uVar35 = uVar35 - 1;
              lVar30 = lVar30 + 4;
            } while (1 < uVar35);
          }
          uVar22 = uVar22 + 1;
          pvVar31 = (void *)((long)pvVar31 + sVar12 * sVar8);
          pvVar28 = (void *)((long)pvVar28 + sVar11 * sVar13);
          pvVar27 = (void *)((long)pvVar27 + sVar10 * sVar14);
        } while (uVar22 != uVar26);
      }
      uVar22 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar25 >> 3) *
               -0x71c71c71c71c71c7;
      if (uVar22 < 3) {
        return 0;
      }
      uVar24 = 2;
      do {
        if (0 < (int)uVar7) {
          pvVar27 = pMVar25[uVar24].data;
          sVar10 = pMVar25[uVar24].cstep;
          sVar11 = pMVar25[uVar24].elemsize;
          pvVar28 = this_00->data;
          sVar12 = this_00->elemsize;
          uVar33 = 0;
          do {
            if (0 < iVar34) {
              lVar30 = 0;
              uVar35 = iVar34 + 1;
              do {
                fVar4 = *(float *)((long)pvVar28 + lVar30);
                if (*(float *)((long)pvVar28 + lVar30) <= *(float *)((long)pvVar27 + lVar30)) {
                  fVar4 = *(float *)((long)pvVar27 + lVar30);
                }
                *(float *)((long)pvVar28 + lVar30) = fVar4;
                uVar35 = uVar35 - 1;
                lVar30 = lVar30 + 4;
              } while (1 < uVar35);
            }
            uVar33 = uVar33 + 1;
            pvVar28 = (void *)((long)pvVar28 + sVar12 * sVar8);
            pvVar27 = (void *)((long)pvVar27 + sVar10 * sVar11);
          } while (uVar33 != uVar26);
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 != uVar22);
    }
    return 0;
  }
  return -100;
}

Assistant:

int Eltwise_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_add_ps(_p, _p1);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m256 _coeff0 = _mm256_set1_ps(coeffs[0]);
                __m256 _coeff1 = _mm256_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_mul_ps(_p, _coeff0);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff1, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m256 _coeff = _mm256_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_comp_fmadd_ps(_p1, _coeff, _p);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_max_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_mul_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p = _mm_load_ps(outptr);
                            __m128 _p1 = _mm_load_ps(ptr);
                            _p = _mm_add_ps(_p, _p1);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m128 _coeff0 = _mm_set1_ps(coeffs[0]);
                __m128 _coeff1 = _mm_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_mul_ps(_p, _coeff0);
                        _p1 = _mm_mul_ps(_p1, _coeff1);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m128 _coeff = _mm_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p1 = _mm_load_ps(ptr);
                            __m128 _p = _mm_load_ps(outptr);
                            _p1 = _mm_mul_ps(_p1, _coeff);
                            _p = _mm_add_ps(_p1, _p);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_max_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}